

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O0

time_t cdash_current_time(char *strtime)

{
  size_t sVar1;
  char *in_RDI;
  size_t i;
  char s [20];
  tm d1;
  time_t t1;
  char local_68 [24];
  tm local_50;
  time_t local_18;
  char *local_10;
  time_t local_8;
  
  local_10 = in_RDI;
  local_18 = time((time_t *)0x0);
  gmtime_r(&local_18,&local_50);
  if (local_10 == (char *)0x0) {
    local_8 = local_18;
  }
  else {
    sVar1 = strftime(local_68,0x14,"%b %d %H:%M EDT",&local_50);
    strncpy(local_10,local_68,sVar1 + 1);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

static time_t cdash_current_time(char *strtime) {
    time_t t1;
    struct tm d1;
    char s[20];
    size_t i;

    t1 = time(0);
    gmtime_r(&t1, &d1);

    if(strtime == NULL)
        return t1;

    i = strftime(s, 20, "%b %d %H:%M EDT", &d1);

    strncpy(strtime, s, i+1);

    return t1;
}